

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

void arkPrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  fprintf((FILE *)outfile,"itol = %i\n",(ulong)(uint)ark_mem->itol);
  fprintf((FILE *)outfile,"ritol = %i\n",(ulong)(uint)ark_mem->ritol);
  fprintf((FILE *)outfile,"mxhnil = %i\n",(ulong)(uint)ark_mem->mxhnil);
  fprintf((FILE *)outfile,"mxstep = %li\n",ark_mem->mxstep);
  fprintf((FILE *)outfile,"lrw1 = %li\n",(long)ark_mem->lrw1);
  fprintf((FILE *)outfile,"liw1 = %li\n",(long)ark_mem->liw1);
  fprintf((FILE *)outfile,"lrw = %li\n",ark_mem->lrw);
  fprintf((FILE *)outfile,"liw = %li\n",ark_mem->liw);
  fprintf((FILE *)outfile,"user_efun = %i\n",(ulong)(uint)ark_mem->user_efun);
  fprintf((FILE *)outfile,"tstopset = %i\n",(ulong)(uint)ark_mem->tstopset);
  fprintf((FILE *)outfile,"tstop = %.16g\n",ark_mem->tstop);
  fprintf((FILE *)outfile,"report = %i\n",(ulong)(uint)ark_mem->report);
  fprintf((FILE *)outfile,"VabstolMallocDone = %i\n",(ulong)(uint)ark_mem->VabstolMallocDone);
  fprintf((FILE *)outfile,"MallocDone = %i\n",(ulong)(uint)ark_mem->MallocDone);
  fprintf((FILE *)outfile,"initsetup = %i\n",(ulong)(uint)ark_mem->initsetup);
  fprintf((FILE *)outfile,"init_type = %i\n",(ulong)(uint)ark_mem->init_type);
  fprintf((FILE *)outfile,"firststage = %i\n",(ulong)(uint)ark_mem->firststage);
  fprintf((FILE *)outfile,"uround = %.16g\n",ark_mem->uround);
  fprintf((FILE *)outfile,"reltol = %.16g\n",ark_mem->reltol);
  fprintf((FILE *)outfile,"Sabstol = %.16g\n",ark_mem->Sabstol);
  fprintf((FILE *)outfile,"fixedstep = %i\n",(ulong)(uint)ark_mem->fixedstep);
  fprintf((FILE *)outfile,"tolsf = %.16g\n",ark_mem->tolsf);
  fprintf((FILE *)outfile,"call_fullrhs = %i\n",(ulong)(uint)ark_mem->call_fullrhs);
  fprintf((FILE *)outfile,"nhnil = %i\n",(ulong)(uint)ark_mem->nhnil);
  fprintf((FILE *)outfile,"nst_attempts = %li\n",ark_mem->nst_attempts);
  fprintf((FILE *)outfile,"nst = %li\n",ark_mem->nst);
  fprintf((FILE *)outfile,"ncfn = %li\n",ark_mem->ncfn);
  fprintf((FILE *)outfile,"netf = %li\n",ark_mem->netf);
  fprintf((FILE *)outfile,"hin = %.16g\n",ark_mem->hin);
  fprintf((FILE *)outfile,"h = %.16g\n",ark_mem->h);
  fprintf((FILE *)outfile,"hprime = %.16g\n",ark_mem->hprime);
  fprintf((FILE *)outfile,"next_h = %.16g\n",ark_mem->next_h);
  fprintf((FILE *)outfile,"eta = %.16g\n",ark_mem->eta);
  fprintf((FILE *)outfile,"tcur = %.16g\n",ark_mem->tcur);
  fprintf((FILE *)outfile,"tretlast = %.16g\n",ark_mem->tretlast);
  fprintf((FILE *)outfile,"hmin = %.16g\n",ark_mem->hmin);
  fprintf((FILE *)outfile,"hmax_inv = %.16g\n",ark_mem->hmax_inv);
  fprintf((FILE *)outfile,"h0u = %.16g\n",ark_mem->h0u);
  fprintf((FILE *)outfile,"tn = %.16g\n",ark_mem->tn);
  fprintf((FILE *)outfile,"hold = %.16g\n",ark_mem->hold);
  fprintf((FILE *)outfile,"maxnef = %i\n",(ulong)(uint)ark_mem->maxnef);
  fprintf((FILE *)outfile,"maxncf = %i\n",(ulong)(uint)ark_mem->maxncf);
  fwrite("timestep adaptivity structure:\n",0x1f,1,(FILE *)outfile);
  arkPrintAdaptMem(ark_mem->hadapt_mem,outfile);
  fprintf((FILE *)outfile,"constraintsSet = %i\n",(ulong)(uint)ark_mem->constraintsSet);
  fprintf((FILE *)outfile,"maxconstrfails = %i\n",(ulong)(uint)ark_mem->maxconstrfails);
  if (ark_mem->root_mem != (ARKodeRootMem)0x0) {
    arkPrintRootMem(ark_mem,outfile);
  }
  arkInterpPrintMem(ark_mem->interp,outfile);
  return;
}

Assistant:

void arkPrintMem(ARKodeMem ark_mem, FILE *outfile)
{
  /* output general values */
  fprintf(outfile, "itol = %i\n", ark_mem->itol);
  fprintf(outfile, "ritol = %i\n", ark_mem->ritol);
  fprintf(outfile, "mxhnil = %i\n", ark_mem->mxhnil);
  fprintf(outfile, "mxstep = %li\n", ark_mem->mxstep);
  fprintf(outfile, "lrw1 = %li\n", (long int) ark_mem->lrw1);
  fprintf(outfile, "liw1 = %li\n", (long int) ark_mem->liw1);
  fprintf(outfile, "lrw = %li\n", (long int) ark_mem->lrw);
  fprintf(outfile, "liw = %li\n", (long int) ark_mem->liw);
  fprintf(outfile, "user_efun = %i\n", ark_mem->user_efun);
  fprintf(outfile, "tstopset = %i\n", ark_mem->tstopset);
  fprintf(outfile, "tstop = %" RSYM"\n", ark_mem->tstop);
  fprintf(outfile, "report = %i\n", ark_mem->report);
  fprintf(outfile, "VabstolMallocDone = %i\n", ark_mem->VabstolMallocDone);
  fprintf(outfile, "MallocDone = %i\n", ark_mem->MallocDone);
  fprintf(outfile, "initsetup = %i\n", ark_mem->initsetup);
  fprintf(outfile, "init_type = %i\n", ark_mem->init_type);
  fprintf(outfile, "firststage = %i\n", ark_mem->firststage);
  fprintf(outfile, "uround = %" RSYM"\n", ark_mem->uround);
  fprintf(outfile, "reltol = %" RSYM"\n", ark_mem->reltol);
  fprintf(outfile, "Sabstol = %" RSYM"\n", ark_mem->Sabstol);
  fprintf(outfile, "fixedstep = %i\n", ark_mem->fixedstep);
  fprintf(outfile, "tolsf = %" RSYM"\n", ark_mem->tolsf);
  fprintf(outfile, "call_fullrhs = %i\n", ark_mem->call_fullrhs);

  /* output counters */
  fprintf(outfile, "nhnil = %i\n", ark_mem->nhnil);
  fprintf(outfile, "nst_attempts = %li\n", ark_mem->nst_attempts);
  fprintf(outfile, "nst = %li\n", ark_mem->nst);
  fprintf(outfile, "ncfn = %li\n", ark_mem->ncfn);
  fprintf(outfile, "netf = %li\n", ark_mem->netf);

  /* output time-stepping values */
  fprintf(outfile, "hin = %" RSYM"\n", ark_mem->hin);
  fprintf(outfile, "h = %" RSYM"\n", ark_mem->h);
  fprintf(outfile, "hprime = %" RSYM"\n", ark_mem->hprime);
  fprintf(outfile, "next_h = %" RSYM"\n", ark_mem->next_h);
  fprintf(outfile, "eta = %" RSYM"\n", ark_mem->eta);
  fprintf(outfile, "tcur = %" RSYM"\n", ark_mem->tcur);
  fprintf(outfile, "tretlast = %" RSYM"\n", ark_mem->tretlast);
  fprintf(outfile, "hmin = %" RSYM"\n", ark_mem->hmin);
  fprintf(outfile, "hmax_inv = %" RSYM"\n", ark_mem->hmax_inv);
  fprintf(outfile, "h0u = %" RSYM"\n", ark_mem->h0u);
  fprintf(outfile, "tn = %" RSYM"\n", ark_mem->tn);
  fprintf(outfile, "hold = %" RSYM"\n", ark_mem->hold);
  fprintf(outfile, "maxnef = %i\n", ark_mem->maxnef);
  fprintf(outfile, "maxncf = %i\n", ark_mem->maxncf);

  /* output time-stepping adaptivity structure */
  fprintf(outfile, "timestep adaptivity structure:\n");
  arkPrintAdaptMem(ark_mem->hadapt_mem, outfile);

  /* output inequality constraints quantities */
  fprintf(outfile, "constraintsSet = %i\n", ark_mem->constraintsSet);
  fprintf(outfile, "maxconstrfails = %i\n", ark_mem->maxconstrfails);

  /* output root-finding quantities */
  if (ark_mem->root_mem != NULL)
    (void) arkPrintRootMem((void*) ark_mem, outfile);

  /* output interpolation quantities */
  arkInterpPrintMem(ark_mem->interp, outfile);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  fprintf(outfile, "Vapbsol:\n");
  N_VPrintFile(ark_mem->Vabstol, outfile);
  fprintf(outfile, "ewt:\n");
  N_VPrintFile(ark_mem->ewt, outfile);
  if (!ark_mem->rwt_is_ewt) {
    fprintf(outfile, "rwt:\n");
    N_VPrintFile(ark_mem->rwt, outfile);
  }
  fprintf(outfile, "ycur:\n");
  N_VPrintFile(ark_mem->ycur, outfile);
  fprintf(outfile, "yn:\n");
  N_VPrintFile(ark_mem->yn, outfile);
  fprintf(outfile, "fn:\n");
  N_VPrintFile(ark_mem->fn, outfile);
  fprintf(outfile, "tempv1:\n");
  N_VPrintFile(ark_mem->tempv1, outfile);
  fprintf(outfile, "tempv2:\n");
  N_VPrintFile(ark_mem->tempv2, outfile);
  fprintf(outfile, "tempv3:\n");
  N_VPrintFile(ark_mem->tempv3, outfile);
  fprintf(outfile, "tempv4:\n");
  N_VPrintFile(ark_mem->tempv4, outfile);
  fprintf(outfile, "constraints:\n");
  N_VPrintFile(ark_mem->constraints, outfile);
#endif

}